

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::UpdateArrayValueTypes(BackwardPass *this,Instr *instr,Opnd *origOpnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  ValueType VVar6;
  undefined4 *puVar7;
  anon_union_8_2_fd66ddfd_for_StackSym_35 aVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar16;
  StackSym *pSVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  Opnd *pOVar12;
  undefined7 extraout_var_01;
  RegOpnd *pRVar13;
  ArrayRegOpnd *this_00;
  ArrayRegOpnd *pAVar14;
  IndirOpnd *this_01;
  StackSym *pSVar15;
  byte bVar17;
  BasicBlock *pBVar18;
  char *IsCheckedUse;
  ulong extraout_RDX;
  ulong uVar19;
  uint uVar20;
  Instr **in_R8;
  anon_union_8_2_fd66ddfd_for_StackSym_35 aVar21;
  byte bVar22;
  anon_union_8_2_fd66ddfd_for_StackSym_35 local_68;
  ArrayRegOpnd *arrayOpnd;
  undefined4 local_54;
  undefined4 *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  uint local_44;
  undefined1 uStack_40;
  undefined3 uStack_3f;
  ValueType checkedSrcValueType;
  uint uStack_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1372,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar2) goto LAB_003e3be5;
    *puVar7 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1373,"(!IsPrePass())","!IsPrePass()");
    if (!bVar2) goto LAB_003e3be5;
    *puVar7 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1374,"(instr)","instr");
    if (!bVar2) goto LAB_003e3be5;
    *puVar7 = 0;
  }
  if (origOpnd == (Opnd *)0x0) {
    return;
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) == StElemC) {
    return;
  }
  OVar3 = IR::Opnd::GetKind(origOpnd);
  aVar21 = (anon_union_8_2_fd66ddfd_for_StackSym_35)origOpnd;
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind(origOpnd);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar2) goto LAB_003e3be5;
      *puVar7 = 0;
    }
    if (*(char *)((long)origOpnd[1]._vptr_Opnd + 0x14) != '\x02') {
      return;
    }
    aVar8.m_instrDef = (Instr *)0x0;
  }
  else {
    if (OVar3 != OpndKindReg) {
      if (OVar3 != OpndKindIndir) {
        return;
      }
      OVar3 = IR::Opnd::GetKind(origOpnd);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) goto LAB_003e3be5;
        *puVar7 = 0;
      }
      aVar21 = (anon_union_8_2_fd66ddfd_for_StackSym_35)
               ((anon_union_8_2_fd66ddfd_for_StackSym_35 *)(origOpnd + 1))->m_instrDef;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)aVar21.m_instrDef);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_003e3be5;
      *puVar7 = 0;
    }
    bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)aVar21.m_instrDef);
    if (bVar2) {
      bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)aVar21.m_instrDef);
      aVar8 = aVar21;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
        if (!bVar2) goto LAB_003e3be5;
        *puVar7 = 0;
      }
    }
    else {
      aVar8.m_instrDef = (Instr *)0x0;
    }
  }
  local_32[0] = ((ValueType *)&(aVar21.m_instrDef)->m_noLazyHelperAssert)->field_0;
  local_68 = aVar8;
  arrayOpnd = (ArrayRegOpnd *)aVar21;
  _uStack_40 = aVar8;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    return;
  }
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  bVar4 = ValueType::IsOptimizedTypedArray((ValueType *)&local_32[0].field_0);
  pAVar14 = arrayOpnd;
  local_50 = (undefined4 *)CONCAT71(local_50._1_7_,bVar2);
  uVar16 = extraout_var;
  if (bVar2 == bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x13aa,"(!isJsArray == valueType.IsOptimizedTypedArray())",
                       "!isJsArray == valueType.IsOptimizedTypedArray()");
    if (!bVar2) goto LAB_003e3be5;
    *puVar7 = 0;
    uVar16 = extraout_var_00;
  }
  pBVar18 = this->currentBlock;
  pBVar11 = pBVar18->noImplicitCallUses;
  do {
    pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)pBVar11->head;
    if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
  } while (((Type *)&pBVar11->alloc)->word == 0);
  if ((byte)local_50 == '\0') {
    uVar19 = 0;
    local_54 = 0;
LAB_003e3623:
    bVar22 = false;
  }
  else {
    local_54 = (undefined4)CONCAT71(uVar16,pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0);
    bVar22 = (pAVar14->super_RegOpnd).super_Opnd.field_0xb;
    if ((bVar22 & 1) == 0) {
      bVar2 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0);
      if (bVar2) {
        uVar19 = 0;
      }
      else {
        pBVar10 = this->currentBlock->noImplicitCallNativeArrayUses;
        uVar19 = extraout_RDX;
        do {
          pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
          uVar19 = CONCAT71((int7)(uVar19 >> 8),
                            pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0);
          if (pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
        } while (((Type *)&pBVar10->alloc)->word == 0);
      }
    }
    else {
      uVar19 = 0;
    }
    local_54 = CONCAT31((int3)((uint)local_54 >> 8),(byte)local_54 & (bVar22 ^ 1));
    if (((arrayOpnd->super_RegOpnd).super_Opnd.field_0xb & 1) != 0) {
      pBVar18 = this->currentBlock;
      goto LAB_003e3623;
    }
    uVar19 = uVar19 & 0xffffffff;
    bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    pBVar18 = this->currentBlock;
    if (bVar2) {
      pBVar10 = pBVar18->noImplicitCallNoMissingValuesUses;
      do {
        pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
        bVar22 = pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if ((bool)bVar22) break;
      } while (((Type *)&pBVar10->alloc)->word == 0);
    }
    else {
      bVar22 = false;
    }
  }
  aVar21 = _uStack_40;
  pBVar10 = pBVar18->noImplicitCallJsArrayHeadSegmentSymUses;
  do {
    pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
    if (pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
  } while (((Type *)&pBVar10->alloc)->word == 0);
  local_44 = (uint)uVar19;
  if (((byte)local_50 & _uStack_40 != (Instr *)0x0) == 0) {
    if (_uStack_40 == (Instr *)0x0) {
      _uStack_40 = (ulong)uStack_3c << 0x20;
    }
    else {
      if ((byte)local_50 != 0) {
        pBVar11 = pBVar10;
      }
      uStack_40 = pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0 &&
                  (StackSym *)_uStack_40->globOptInstrString != (StackSym *)0x0;
      in_R8 = (Instr **)(ulong)(byte)uStack_40;
      uStack_3f = 0;
    }
    bVar2 = false;
  }
  else {
    bVar2 = _uStack_40->m_func != (Func *)0x0 &&
            pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
    _uStack_40 = (int)CONCAT71((int7)((ulong)pBVar18 >> 8),
                               (StackSym *)_uStack_40->globOptInstrString != (StackSym *)0x0 &&
                               pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0);
    pSVar9 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)aVar21.m_instrDef);
    if ((pSVar9 != (StackSym *)0x0) &&
       (bVar4 = ValueType::IsArray((ValueType *)&local_32[0].field_0), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x13be,
                         "(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray())"
                         ,
                         "!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray()"
                        );
      if (!bVar4) goto LAB_003e3be5;
      *puVar7 = 0;
    }
    uVar19 = (ulong)local_44;
  }
  aVar21 = local_68;
  if ((local_68.m_instrDef != (Instr *)0x0 & (byte)local_50) == 1) {
    pSVar9 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)local_68.m_instrDef);
    if (pSVar9 == (StackSym *)0x0) {
      bVar4 = false;
      uVar19 = (ulong)local_44;
    }
    else {
      pBVar11 = this->currentBlock->noImplicitCallArrayLengthSymUses;
      uVar19 = (ulong)local_44;
      do {
        pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)pBVar11->head;
        bVar4 = pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0;
        if (bVar4) break;
      } while (((Type *)&pBVar11->alloc)->word == 0);
    }
  }
  else {
    bVar4 = false;
  }
  IsCheckedUse._1_7_ = (undefined7)((uVar19 & 0xffffffff) >> 8);
  IsCheckedUse._0_1_ = (byte)(uVar19 & 0xffffffff) | bVar2 | (byte)local_54 | bVar22 | uStack_40;
  if ((byte)IsCheckedUse != 1) {
    return;
  }
  pAVar14 = arrayOpnd;
  if (arrayOpnd != (ArrayRegOpnd *)instr->m_dst) {
    if ((byte)local_50 == '\0') {
      if (uStack_40 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_50 = 1;
        IsCheckedUse = "removeHeadSegmentLengthSym";
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x140e,"(removeHeadSegmentLengthSym)","removeHeadSegmentLengthSym");
        if (!bVar5) goto LAB_003e3be5;
        *local_50 = 0;
      }
      pOVar12 = FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__1>
                          ((BackwardPass *)instr,(Instr *)(aVar21.m_instrDef)->globOptInstrString,
                           (StackSym *)&local_68,(anon_class_8_1_c0a7bff0)IsCheckedUse,in_R8);
      aVar21 = _uStack_40;
      bVar17 = (byte)_uStack_40;
      uStack_3f = (int3)((ulong)_uStack_40 >> 8);
      uStack_40 = bVar17 & pOVar12 == (Opnd *)0x0;
      uStack_3c = SUB84(aVar21.constantValue,4);
    }
    else {
      pOVar12 = FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__0>
                          ((BackwardPass *)instr,(Instr *)arrayOpnd,(Opnd *)&local_32[0].field_0,
                           (anon_class_8_1_e7f4faeb)IsCheckedUse,in_R8);
      if (pOVar12 != (Opnd *)0x0) {
        local_46 = (pOVar12->m_valueType).field_0;
        if ((char)local_44 == '\0') {
          uVar19 = 0;
        }
        else {
          bVar5 = ValueType::HasVarElements((ValueType *)&local_46.field_0);
          uVar19 = 1;
          if (!bVar5) {
            bVar5 = ValueType::HasIntElements((ValueType *)&local_46.field_0);
            local_50 = (undefined4 *)CONCAT71(local_50._1_7_,bVar5);
            bVar5 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
            uVar19 = (ulong)(bVar5 ^ (byte)local_50);
          }
        }
        if ((bool)bVar22 == false) {
          uVar20 = 0;
        }
        else {
          bVar5 = ValueType::HasNoMissingValues((ValueType *)&local_46.field_0);
          uVar20 = (uint)CONCAT71(extraout_var_01,bVar5) ^ 1;
        }
        if ((byte)((byte)_uStack_40 | bVar2 | bVar4) == 1) {
          local_50 = (undefined4 *)CONCAT44(local_50._4_4_,uVar20);
          OVar3 = IR::Opnd::GetKind(pOVar12);
          pAVar14 = arrayOpnd;
          if (OVar3 == OpndKindReg) {
            pRVar13 = IR::Opnd::AsRegOpnd(pOVar12);
            bVar5 = IR::RegOpnd::IsArrayRegOpnd(pRVar13);
            pAVar14 = arrayOpnd;
            if (bVar5) {
              pRVar13 = IR::Opnd::AsRegOpnd(pOVar12);
              this_00 = IR::RegOpnd::AsArrayRegOpnd(pRVar13);
              pAVar14 = arrayOpnd;
              if (bVar2 == false) {
                bVar2 = false;
              }
              else {
                bVar2 = (Func *)this_00->headSegmentSym != (local_68.m_instrDef)->m_func;
              }
              if (uStack_40 == '\0') {
                _uStack_40 = (ulong)uStack_3c << 0x20;
              }
              else {
                _uStack_40 = (int)CONCAT71((int7)((ulong)this_00->headSegmentLengthSym >> 8),
                                           this_00->headSegmentLengthSym !=
                                           (StackSym *)(local_68.m_instrDef)->globOptInstrString);
              }
              if (bVar4 == false) {
                bVar4 = false;
              }
              else {
                pSVar9 = IR::ArrayRegOpnd::LengthSym(this_00);
                pSVar15 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)local_68.m_instrDef);
                bVar4 = pSVar9 != pSVar15;
              }
            }
          }
          uVar20 = (uint)local_50;
        }
        else {
          bVar4 = false;
          _uStack_40 = _uStack_40 & 0xffffffff00000000;
          bVar2 = false;
          pAVar14 = arrayOpnd;
        }
        bVar22 = (byte)uVar20;
        local_54 = 0;
        goto LAB_003e399d;
      }
    }
    uVar19 = (ulong)local_44;
    pAVar14 = arrayOpnd;
  }
LAB_003e399d:
  aVar21 = local_68;
  if (((char)uVar19 == '\0') && ((char)local_54 == '\0')) {
    if (bVar22 != 0) {
      VVar6 = ValueType::SetHasNoMissingValues((ValueType *)&local_32[0].field_0,false);
      IR::Opnd::SetValueType((Opnd *)pAVar14,VVar6);
    }
    aVar21 = local_68;
    if (bVar2 != false) {
      if (local_68.m_instrDef == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x143e,"(arrayOpnd)","arrayOpnd");
        if (!bVar2) goto LAB_003e3be5;
        *puVar7 = 0;
      }
      (aVar21.m_instrDef)->m_func = (Func *)0x0;
    }
    aVar21 = local_68;
    if (uStack_40 != '\0') {
      if (local_68.m_instrDef == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1443,"(arrayOpnd)","arrayOpnd");
        if (!bVar2) goto LAB_003e3be5;
        *puVar7 = 0;
      }
      (aVar21.m_instrDef)->globOptInstrString = (char16 *)0x0;
    }
    aVar21 = local_68;
    if (bVar4 != false) {
      if (local_68.m_instrDef == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1448,"(arrayOpnd)","arrayOpnd");
        if (!bVar2) {
LAB_003e3be5:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      IR::ArrayRegOpnd::RemoveLengthSym((ArrayRegOpnd *)aVar21.m_instrDef);
    }
  }
  else {
    if (local_68.m_instrDef != (Instr *)0x0) {
      pAVar14 = (ArrayRegOpnd *)
                IR::ArrayRegOpnd::CopyAsRegOpnd((ArrayRegOpnd *)local_68.m_instrDef,instr->m_func);
      OVar3 = IR::Opnd::GetKind(origOpnd);
      if (OVar3 == OpndKindIndir) {
        this_01 = IR::Opnd::AsIndirOpnd(origOpnd);
        pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)pAVar14);
        IR::IndirOpnd::ReplaceBaseOpnd(this_01,pRVar13);
      }
      else {
        IR::Instr::Replace(instr,(Opnd *)aVar21.m_instrDef,(Opnd *)pAVar14);
      }
      local_68.m_instrDef = (Instr *)0x0;
    }
    VVar6 = ValueType::ToLikely((ValueType *)&local_32[0].field_0);
    IR::Opnd::SetValueType((Opnd *)pAVar14,VVar6);
  }
  return;
}

Assistant:

void
BackwardPass::UpdateArrayValueTypes(IR::Instr *const instr, IR::Opnd *origOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsPrePass());
    Assert(instr);

    if(!origOpnd)
    {
        return;
    }

    IR::Instr *opndOwnerInstr = instr;
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StArrSegElemC:
            // These may not be fixed if we are unsure about the type of the array they're storing to
            // (because it relies on profile data) and we weren't able to hoist the array check.
            return;
    }

    Sym *sym;
    IR::Opnd* opnd = origOpnd;
    IR::ArrayRegOpnd *arrayOpnd;
    switch(opnd->GetKind())
    {
        case IR::OpndKindIndir:
            opnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            // fall-through

        case IR::OpndKindReg:
        {
            IR::RegOpnd *const regOpnd = opnd->AsRegOpnd();
            sym = regOpnd->m_sym;
            arrayOpnd = regOpnd->IsArrayRegOpnd() ? regOpnd->AsArrayRegOpnd() : nullptr;
            break;
        }

        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            if(!sym->IsPropertySym())
            {
                return;
            }
            arrayOpnd = nullptr;
            break;

        default:
            return;
    }

    const ValueType valueType(opnd->GetValueType());
    if(!valueType.IsAnyOptimizedArray())
    {
        return;
    }

    const bool isJsArray = valueType.IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueType.IsOptimizedTypedArray());

    const bool noForwardImplicitCallUses = currentBlock->noImplicitCallUses->IsEmpty();
    bool changeArray = isJsArray && !opnd->IsValueTypeFixed() && noForwardImplicitCallUses;
    bool changeNativeArray =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        !valueType.HasVarElements() &&
        currentBlock->noImplicitCallNativeArrayUses->IsEmpty();
    bool changeNoMissingValues =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        valueType.HasNoMissingValues() &&
        currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty();
    const bool noForwardJsArrayHeadSegmentSymUses = currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty();
    bool removeHeadSegmentSym = isJsArray && arrayOpnd && arrayOpnd->HeadSegmentSym() && noForwardJsArrayHeadSegmentSymUses;
    bool removeHeadSegmentLengthSym =
        arrayOpnd &&
        arrayOpnd->HeadSegmentLengthSym() &&
        (isJsArray ? noForwardJsArrayHeadSegmentSymUses : noForwardImplicitCallUses);
    Assert(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray());
    bool removeLengthSym =
        isJsArray &&
        arrayOpnd &&
        arrayOpnd->LengthSym() &&
        currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty();
    if(!(changeArray || changeNoMissingValues || changeNativeArray || removeHeadSegmentSym || removeHeadSegmentLengthSym))
    {
        return;
    }

    // We have a definitely-array value type for the base, but either implicit calls are not currently being disabled for
    // legally using the value type as a definite array, or we are not currently bailing out upon creating a missing value
    // for legally using the value type as a definite array with no missing values.

    // For source opnds, ensure that a NoImplicitCallUses immediately precedes this instruction. Otherwise, convert the value
    // type to an appropriate version so that the lowerer doesn't incorrectly treat it as it says.
    if(opnd != opndOwnerInstr->GetDst())
    {
        if(isJsArray)
        {
            IR::Opnd *const checkedSrc =
                FindNoImplicitCallUse(
                    instr,
                    opnd,
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                        return
                            checkedSrcValueType.IsLikelyObject() &&
                            checkedSrcValueType.GetObjectType() == valueType.GetObjectType();
                    });
            if(checkedSrc)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                changeArray = false;

                const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                if(changeNativeArray &&
                    !checkedSrcValueType.HasVarElements() &&
                    checkedSrcValueType.HasIntElements() == valueType.HasIntElements())
                {
                    // If necessary, instructions before this will bail out on converting a native array
                    changeNativeArray = false;
                }

                if(changeNoMissingValues && checkedSrcValueType.HasNoMissingValues())
                {
                    // If necessary, instructions before this will bail out on creating a missing value
                    changeNoMissingValues = false;
                }

                if((removeHeadSegmentSym || removeHeadSegmentLengthSym || removeLengthSym) && checkedSrc->IsRegOpnd())
                {
                    IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                    if(checkedRegSrc->IsArrayRegOpnd())
                    {
                        IR::ArrayRegOpnd *const checkedArraySrc = checkedSrc->AsRegOpnd()->AsArrayRegOpnd();
                        if(removeHeadSegmentSym && checkedArraySrc->HeadSegmentSym() == arrayOpnd->HeadSegmentSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment sym
                            removeHeadSegmentSym = false;
                        }
                        if(removeHeadSegmentLengthSym &&
                            checkedArraySrc->HeadSegmentLengthSym() == arrayOpnd->HeadSegmentLengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment length sym
                            removeHeadSegmentLengthSym = false;
                        }
                        if(removeLengthSym && checkedArraySrc->LengthSym() == arrayOpnd->LengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating a length sym
                            removeLengthSym = false;
                        }
                    }
                }
            }
        }
        else
        {
            Assert(removeHeadSegmentLengthSym);

            // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web worker,
            // so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there are no forward
            // uses of any head segment length syms, to allow removing the extracted head segment length
            // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
            // removed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                removeHeadSegmentLengthSym = false;
            }
        }
    }

    if(changeArray || changeNativeArray)
    {
        if(arrayOpnd)
        {
            opnd = arrayOpnd->CopyAsRegOpnd(opndOwnerInstr->m_func);
            if (origOpnd->IsIndirOpnd())
            {
                origOpnd->AsIndirOpnd()->ReplaceBaseOpnd(opnd->AsRegOpnd());
            }
            else
            {
                opndOwnerInstr->Replace(arrayOpnd, opnd);
            }
            arrayOpnd = nullptr;
        }
        opnd->SetValueType(valueType.ToLikely());
    }
    else
    {
        if(changeNoMissingValues)
        {
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
        if(removeHeadSegmentSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentSym();
        }
        if(removeHeadSegmentLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentLengthSym();
        }
        if(removeLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveLengthSym();
        }
    }
}